

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall soplex::CLUFactor<double>::packRows(CLUFactor<double> *this)

{
  U *pUVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  Dring *pDVar11;
  long lVar12;
  
  pUVar1 = &this->u;
  pdVar4 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->u).row.idx;
  piVar6 = (this->u).row.len;
  piVar7 = (this->u).row.max;
  piVar8 = (this->u).row.start;
  uVar9 = 0;
  pDVar11 = (Dring *)pUVar1;
  while (pDVar11 = (((Row *)&pDVar11->next)->list).next, (U *)pDVar11 != pUVar1) {
    iVar2 = pDVar11->idx;
    if (piVar8[iVar2] != (int)uVar9) goto LAB_001a74ee;
    iVar3 = piVar6[iVar2];
    uVar9 = (ulong)(uint)((int)uVar9 + iVar3);
    piVar7[iVar2] = iVar3;
  }
LAB_001a752f:
  piVar7[this->thedim] = 0;
  (this->u).row.used = (int)uVar9;
  return;
LAB_001a74ee:
  do {
    iVar2 = pDVar11->idx;
    lVar10 = (long)piVar8[iVar2];
    piVar8[iVar2] = (int)uVar9;
    iVar3 = piVar6[iVar2];
    piVar7[iVar2] = iVar3;
    lVar12 = iVar3 + lVar10;
    uVar9 = (ulong)(int)uVar9;
    for (; lVar10 < lVar12; lVar10 = lVar10 + 1) {
      piVar5[uVar9] = piVar5[lVar10];
      pdVar4[uVar9] = pdVar4[lVar10];
      uVar9 = uVar9 + 1;
    }
    pDVar11 = pDVar11->next;
  } while ((U *)pDVar11 != pUVar1);
  goto LAB_001a752f;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}